

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * pack_address_abi_cxx11_(sockaddr_in addr)

{
  allocator local_41f;
  uint16_t local_41e;
  uint local_41c;
  char local_418 [2];
  unsigned_short port;
  uint32_t ip;
  char str_addr [1000];
  uint16_t uStack_26;
  uint32_t uStack_24;
  sockaddr_in addr_local;
  
  uStack_24 = addr.sin_zero._4_4_;
  local_41c = ntohl(uStack_24);
  uStack_26 = addr.sin_zero._2_2_;
  local_41e = ntohs(uStack_26);
  sprintf(local_418,"%d.%d.%d.%d:%d",(ulong)(local_41c >> 0x18),
          (ulong)((local_41c & 0xff0000) >> 0x10),(ulong)(byte)(local_41c >> 8),
          (ulong)(local_41c & 0xff),(uint)local_41e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(addr._0_8_,local_418,&local_41f);
  std::allocator<char>::~allocator((allocator<char> *)&local_41f);
  return addr._0_8_;
}

Assistant:

std::string pack_address(struct sockaddr_in addr) {
    char str_addr[ADDRESS_MAX_SIZE];
    uint32_t ip = ntohl(addr.sin_addr.s_addr);
    unsigned short port = ntohs(addr.sin_port);
    sprintf(str_addr, "%d.%d.%d.%d:%d",
            (ip & 0xff000000) >> 24,
            (ip & 0x00ff0000) >> 16,
            (ip & 0x0000ff00) >> 8,
            (ip & 0x000000ff), port);

    return std::string(str_addr);
}